

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuD3D56TlvUv::adjust_orig_mthd(MthdEmuD3D56TlvUv *this)

{
  result_type rVar1;
  MthdEmuD3D56TlvUv *this_local;
  
  if ((this->fin & 1U) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.notify =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.notify & 0xfffffffe;
    adjust_orig_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig);
  }
  if (((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) && ((this->fin & 1U) != 0)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] = 0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] = 0;
  }
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest
                        .super_Test.rnd);
  if ((rVar1 & 1) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.val =
         (this->super_SingleMthdTest).super_MthdTest.val & 0xff800000;
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                          super_RepeatTest.super_Test.rnd);
    (this->super_SingleMthdTest).super_MthdTest.val =
         1 << ((byte)rVar1 & 0x1f) ^ (this->super_SingleMthdTest).super_MthdTest.val;
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (fin) {
			insrt(orig.notify, 0, 1, 0);
			adjust_orig_icmd(&orig);
		}
		if (cls == 0x48 && fin) {
			// XXX: test me
			exp.valid[0] = 0;
			exp.valid[1] = 0;
		}
		if (rnd() & 1) {
			insrt(val, 0, 23, 0);
			val ^= 1 << (rnd() & 0x1f);
		}
	}